

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfloat16.cpp
# Opt level: O0

void qFloatFromFloat16_fast(float *out,quint16 *in,qsizetype len)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype HalfStep;
  qsizetype Step;
  anon_class_16_2_74ab7d14 convertOneChunk_1;
  anon_class_16_2_74ab7d14 convertOneChunk;
  long offset;
  anon_class_16_2_74ab7d14 *this;
  undefined4 local_68;
  qsizetype in_stack_ffffffffffffffa0;
  quint16 *in_stack_ffffffffffffffa8;
  float *in_stack_ffffffffffffffb0;
  anon_class_16_2_74ab7d14 local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (anon_class_16_2_74ab7d14 *)0x4;
  offset = 0;
  if (in_RDX < 8) {
    bVar2 = hasFastF16Avx256();
    if (bVar2) {
      qFloatFromFloat16_tail_avx256
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
    else if (in_RDX < 4) {
      for (; offset < in_RDX; offset = offset + 1) {
        auVar1 = vcvtph2ps_f16c(ZEXT216(*(ushort *)(in_RSI + offset * 2)));
        local_68 = auVar1._0_4_;
        *(undefined4 *)(in_RDI + offset * 4) = local_68;
      }
    }
    else {
      qFloatFromFloat16_fast::anon_class_16_2_74ab7d14::operator()(local_28,0);
      qFloatFromFloat16_fast::anon_class_16_2_74ab7d14::operator()(local_28,in_RDX + -4);
    }
  }
  else {
    for (; offset + 8 < in_RDX; offset = offset + 8) {
      qFloatFromFloat16_fast::anon_class_16_2_74ab7d14::operator()(this,offset);
    }
    qFloatFromFloat16_fast::anon_class_16_2_74ab7d14::operator()(this,offset);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qFloatFromFloat16_fast(float *out, const quint16 *in, qsizetype len) noexcept
{
    constexpr qsizetype Step = sizeof(__m256i) / sizeof(float);
    constexpr qsizetype HalfStep = sizeof(__m128i) / sizeof(float);
    qsizetype i = 0;

    if (len >= Step) {
        auto convertOneChunk = [=](qsizetype offset) QT_FUNCTION_TARGET(F16C) {
            __m128i f16 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(in + offset));
            __m256 f32 = _mm256_cvtph_ps(f16);
            _mm256_storeu_ps(out + offset, f32);
        };

        // main loop: convert Step (8) floats per iteration
        for ( ; i + Step < len; i += Step)
            convertOneChunk(i);

        // epilogue: convert the last chunk, possibly overlapping with the last
        // iteration of the loop
        return convertOneChunk(len - Step);
    }

#if QT_COMPILER_SUPPORTS_HERE(AVX512VL) && QT_COMPILER_SUPPORTS_HERE(AVX512BW)
    if (hasFastF16Avx256())
        return qFloatFromFloat16_tail_avx256(out, in, len);
#endif

    if (len >= HalfStep) {
        auto convertOneChunk = [=](qsizetype offset) QT_FUNCTION_TARGET(F16C) {
            __m128i f16 = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(in + offset));
            __m128 f32 = _mm_cvtph_ps(f16);
            _mm_storeu_ps(out + offset, f32);
        };

        // two conversions, possibly overlapping
        convertOneChunk(0);
        return convertOneChunk(len - HalfStep);
    }

    // Inlining "qfloat16::operator float()":
    for ( ; i < len; ++i)
        out[i] = _mm_cvtss_f32(_mm_cvtph_ps(_mm_cvtsi32_si128(in[i])));
}